

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void Catch::defaultListListeners
               (ostream *out,
               vector<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_>
               *descriptions)

{
  pointer pLVar1;
  ulong uVar2;
  pointer pLVar3;
  pointer pLVar4;
  pointer pLVar5;
  pointer pLVar6;
  pointer this;
  Column local_108;
  string local_c8;
  Column local_a8;
  Columns local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::operator<<(out,"Registered listeners:\n");
  this = (descriptions->
         super__Vector_base<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_>
         )._M_impl.super__Vector_impl_data._M_start;
  pLVar1 = (descriptions->
           super__Vector_base<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pLVar5 = this;
  pLVar3 = this;
  if (this != pLVar1) {
    while( true ) {
      pLVar6 = pLVar5;
      pLVar5 = pLVar3 + 1;
      uVar2 = (pLVar6->name).m_size;
      if (pLVar5 == pLVar1) break;
      pLVar4 = pLVar3 + 1;
      pLVar3 = pLVar5;
      if ((pLVar4->name).m_size <= uVar2) {
        pLVar5 = pLVar6;
      }
    }
    for (; this != pLVar1; this = this + 1) {
      StringRef::operator_cast_to_string(&local_c8,&this->name);
      std::operator+(&local_50,&local_c8,':');
      TextFlow::Column::Column(&local_a8,&local_50);
      local_a8.m_indent = 2;
      local_a8.m_width = uVar2 + 5;
      TextFlow::Column::Column(&local_108,&this->description);
      local_108.m_initialIndent = 0;
      local_108.m_indent = 2;
      local_108.m_width = 0x48 - uVar2;
      TextFlow::operator+(&local_68,&local_a8,&local_108);
      TextFlow::operator<<(out,&local_68);
      std::operator<<(out,'\n');
      std::vector<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>::~vector
                (&local_68.m_columns);
      std::__cxx11::string::~string((string *)&local_108);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_c8);
    }
    std::operator<<(out,'\n');
    std::ostream::flush();
  }
  return;
}

Assistant:

void defaultListListeners( std::ostream& out,
                               std::vector<ListenerDescription> const& descriptions ) {
        out << "Registered listeners:\n";

        if(descriptions.empty()) {
            return;
        }

        const auto maxNameLen =
            std::max_element( descriptions.begin(),
                              descriptions.end(),
                              []( ListenerDescription const& lhs,
                                  ListenerDescription const& rhs ) {
                                  return lhs.name.size() < rhs.name.size();
                              } )
                ->name.size();

        for ( auto const& desc : descriptions ) {
            out << TextFlow::Column( static_cast<std::string>( desc.name ) +
                                     ':' )
                           .indent( 2 )
                           .width( maxNameLen + 5 ) +
                       TextFlow::Column( desc.description )
                           .initialIndent( 0 )
                           .indent( 2 )
                           .width( CATCH_CONFIG_CONSOLE_WIDTH - maxNameLen - 8 )
                << '\n';
        }

        out << '\n' << std::flush;
    }